

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnexpectedCommand.h
# Opt level: O2

void __thiscall
cmUnexpectedCommand::cmUnexpectedCommand(cmUnexpectedCommand *this,string *name,char *error)

{
  (this->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (this->super_cmCommand).Error._M_dataplus._M_p = (pointer)&(this->super_cmCommand).Error.field_2;
  (this->super_cmCommand).Error._M_string_length = 0;
  (this->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmUnexpectedCommand_005cf6b8;
  std::__cxx11::string::string((string *)&this->Name,(string *)name);
  this->Error = error;
  return;
}

Assistant:

cmUnexpectedCommand(std::string name, const char* error)
    : Name(std::move(name))
    , Error(error)
  {
  }